

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

void Abc_SopComplement(char *pSop)

{
  byte bVar1;
  char cVar2;
  
  do {
    if (*pSop == '\n') {
      bVar1 = pSop[-1];
      if (bVar1 < 0x6e) {
        cVar2 = '1';
        if (bVar1 != 0x30) {
          if (bVar1 != 0x31) {
LAB_001ede08:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                          ,0x267,"void Abc_SopComplement(char *)");
          }
          cVar2 = '0';
        }
      }
      else if (bVar1 == 0x6e) {
        cVar2 = 'x';
      }
      else {
        if (bVar1 != 0x78) goto LAB_001ede08;
        cVar2 = 'n';
      }
      pSop[-1] = cVar2;
    }
    else if (*pSop == '\0') {
      return;
    }
    pSop = pSop + 1;
  } while( true );
}

Assistant:

void Abc_SopComplement( char * pSop )
{
    char * pCur;
    for ( pCur = pSop; *pCur; pCur++ )
        if ( *pCur == '\n' )
        {
            if ( *(pCur - 1) == '0' )
                *(pCur - 1) = '1';
            else if ( *(pCur - 1) == '1' )
                *(pCur - 1) = '0';
            else if ( *(pCur - 1) == 'x' )
                *(pCur - 1) = 'n';
            else if ( *(pCur - 1) == 'n' )
                *(pCur - 1) = 'x';
            else
                assert( 0 );
        }
}